

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

void ncnn::binary_op_broadcast<ncnn::binary_op_div>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *plVar1;
  long *plVar2;
  int *piVar3;
  float *pfVar4;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar5;
  int x_2;
  float *ptr1_2;
  float *ptr_2;
  int y_1;
  int z;
  int binc_2;
  int ainc_2;
  float *outptr_2;
  int q;
  int x_1;
  int binc_1;
  int ainc_1;
  float *outptr_1;
  float *ptr1_1;
  float *ptr_1;
  int y;
  int x;
  int binc;
  int ainc;
  float *outptr;
  float *ptr1;
  float *ptr;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  binary_op_div op;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  void *local_5a0;
  int *local_598;
  ulong local_590;
  undefined4 local_588;
  long *local_580;
  int local_578;
  int local_574;
  int local_570;
  undefined4 local_56c;
  undefined4 local_568;
  ulong local_560;
  void *local_558;
  int *local_550;
  ulong local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  int local_52c;
  int local_528;
  undefined4 local_524;
  undefined4 local_520;
  long local_518;
  float *local_510;
  int local_508 [4];
  int local_4f8;
  int local_4f4;
  void *local_4f0;
  int *local_4e8;
  ulong local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  ulong local_4b0;
  void *local_4a8;
  int *local_4a0;
  ulong local_498;
  undefined4 local_490;
  long *local_488;
  undefined4 local_480;
  int local_47c;
  int local_478;
  undefined4 local_474;
  undefined4 local_470;
  long local_468;
  float *local_460;
  int local_458;
  int local_454;
  uint local_450;
  uint local_44c;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined4 local_430;
  long local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined8 local_408;
  long local_400;
  int local_3f8;
  int local_3f4;
  uint local_3f0;
  uint local_3ec;
  long local_3e8;
  int local_3dc;
  float *local_3d8;
  int local_3cc;
  float *local_3c8;
  int local_3c0;
  int local_3bc;
  uint local_3b8;
  uint local_3b4;
  long local_3b0;
  float *local_3a8;
  float *local_3a0;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  binary_op_div local_381 [9];
  long *local_378;
  long *local_370;
  long *local_368;
  undefined8 *local_360;
  void **local_358;
  void **local_350;
  void **local_340;
  void **local_338;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2d8;
  undefined4 local_2d4;
  void **local_2d0;
  undefined8 *local_2c0;
  void *local_2b0;
  void *local_2a8;
  void *local_298;
  void *local_290;
  undefined8 *local_270;
  int local_25c;
  void **local_258;
  int local_24c;
  void **local_248;
  int local_23c;
  long *local_238;
  int local_22c;
  long *local_228;
  int local_21c;
  long *local_218;
  undefined1 local_20d;
  int local_20c;
  undefined8 *local_200;
  undefined1 local_1d5;
  int local_1d4;
  void **local_1c8;
  undefined1 local_19d;
  int local_19c;
  void **local_190;
  int local_164;
  void **local_160;
  void **local_158;
  int local_14c;
  void **local_148;
  void **local_140;
  long *local_138;
  undefined4 local_12c;
  ulong local_128;
  void *local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  void **local_108;
  long *local_100;
  undefined4 local_f4;
  ulong local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  void **local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  long local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long *local_60;
  undefined4 local_54;
  ulong local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  long *local_30;
  undefined4 local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_388 = (int)in_RDX[5];
  local_38c = *(int *)((long)in_RDX + 0x2c);
  local_390 = (int)in_RDX[6];
  local_394 = *(int *)((long)in_RDX + 0x34);
  local_398 = (int)in_RDX[7];
  local_378 = in_RDX;
  local_370 = in_RSI;
  local_368 = in_RDI;
  if (local_388 == 1) {
    local_3a0 = (float *)*in_RDI;
    local_3a8 = (float *)*in_RSI;
    local_3b0 = *in_RDX;
    local_3b4 = (uint)(1 < *(int *)((long)in_RDI + 0x2c));
    local_3b8 = (uint)(1 < *(int *)((long)in_RSI + 0x2c));
    for (local_3bc = 0; local_3bc < local_38c; local_3bc = local_3bc + 1) {
      fVar5 = binary_op_div::operator()(local_381,local_3a0,local_3a8);
      *(float *)(local_3b0 + (long)local_3bc * 4) = fVar5;
      local_3a0 = local_3a0 + (int)local_3b4;
      local_3a8 = local_3a8 + (int)local_3b8;
    }
  }
  if (local_388 == 2) {
    for (local_3c0 = 0; plVar2 = local_368, local_3c0 < local_390; local_3c0 = local_3c0 + 1) {
      local_3cc = (int)local_368[6] + -1;
      piVar3 = std::min<int>(&local_3c0,&local_3cc);
      plVar1 = local_370;
      local_22c = *piVar3;
      local_228 = plVar2;
      local_3c8 = (float *)(*plVar2 +
                           (long)*(int *)((long)plVar2 + 0x2c) * (long)local_22c * plVar2[2]);
      local_3dc = (int)local_370[6] + -1;
      piVar3 = std::min<int>(&local_3c0,&local_3dc);
      local_23c = *piVar3;
      local_238 = plVar1;
      local_3d8 = (float *)(*plVar1 +
                           (long)*(int *)((long)plVar1 + 0x2c) * (long)local_23c * plVar1[2]);
      local_218 = local_378;
      local_21c = local_3c0;
      local_3e8 = *local_378 +
                  (long)*(int *)((long)local_378 + 0x2c) * (long)local_3c0 * local_378[2];
      local_3ec = (uint)(1 < *(int *)((long)local_368 + 0x2c));
      local_3f0 = (uint)(1 < *(int *)((long)local_370 + 0x2c));
      for (local_3f4 = 0; local_3f4 < local_38c; local_3f4 = local_3f4 + 1) {
        fVar5 = binary_op_div::operator()(local_381,local_3c8,local_3d8);
        *(float *)(local_3e8 + (long)local_3f4 * 4) = fVar5;
        local_3c8 = local_3c8 + (int)local_3ec;
        local_3d8 = local_3d8 + (int)local_3f0;
      }
    }
  }
  if ((local_388 == 3) || (local_388 == 4)) {
    for (local_3f8 = 0; local_3f8 < local_398; local_3f8 = local_3f8 + 1) {
      local_200 = &local_448;
      local_9c = *(int *)((long)local_378 + 0x2c);
      local_a0 = (int)local_378[6];
      local_a4 = *(undefined4 *)((long)local_378 + 0x34);
      local_400 = *local_378 + local_378[8] * (long)local_3f8 * local_378[2];
      local_b8 = local_378[2];
      local_bc = (undefined4)local_378[3];
      local_c8 = local_378[4];
      local_98 = &local_448;
      local_88 = (long)local_9c * (long)local_a0 * local_b8;
      local_270 = &local_448;
      local_360 = &local_448;
      local_8c = 0x10;
      local_20c = local_3f8;
      local_20d = 1;
      local_448 = 0;
      local_438 = 0;
      local_430 = 0;
      local_420 = 0;
      local_41c = 0;
      local_418 = 0;
      local_414 = 0;
      local_410 = 0;
      local_408 = 0;
      local_440 = 0;
      local_44c = (uint)(1 < *(int *)((long)local_368 + 0x2c));
      local_450 = (uint)(1 < *(int *)((long)local_370 + 0x2c));
      local_2c0 = local_360;
      local_b0 = local_400;
      local_428 = local_c8;
      for (local_454 = 0; local_454 < local_394; local_454 = local_454 + 1) {
        for (local_458 = 0; plVar2 = local_368, local_458 < local_390; local_458 = local_458 + 1) {
          local_4f4 = (int)local_368[7] + -1;
          piVar3 = std::min<int>(&local_3f8,&local_4f4);
          local_19c = *piVar3;
          local_190 = &local_4f0;
          local_10c = *(int *)((long)plVar2 + 0x2c);
          local_110 = (int)plVar2[6];
          local_114 = *(undefined4 *)((long)plVar2 + 0x34);
          local_120 = (void *)(*plVar2 + plVar2[8] * (long)local_19c * plVar2[2]);
          local_128 = plVar2[2];
          local_12c = (undefined4)plVar2[3];
          local_138 = (long *)plVar2[4];
          local_108 = &local_4f0;
          local_4e8 = (int *)0x0;
          local_4bc = 1;
          local_68 = (long)local_10c * (long)local_110 * local_128;
          local_4b0 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_128;
          local_4c8 = (int)plVar2[5] + -1;
          if ((int)plVar2[5] == 4) {
            local_4b0 = (long)*(int *)((long)plVar2 + 0x2c) * (long)(int)plVar2[6];
          }
          local_6c = 0x10;
          local_19d = 1;
          local_4f8 = *(int *)((long)local_368 + 0x34) + -1;
          local_4f0 = local_120;
          local_4e0 = local_128;
          local_4d8 = local_12c;
          local_4d0 = local_138;
          local_4c4 = local_10c;
          local_4c0 = local_110;
          local_4b8 = local_114;
          piVar3 = std::min<int>(&local_454,&local_4f8);
          local_14c = *piVar3;
          local_140 = &local_4a8;
          local_148 = &local_4f0;
          local_3c = local_4c4;
          local_40 = local_4c0;
          local_48 = (void *)((long)local_4f0 +
                             (long)local_4c4 * (long)local_4c0 * (long)local_14c * local_4e0);
          local_50 = local_4e0;
          local_54 = local_4d8;
          local_60 = local_4d0;
          local_38 = &local_4a8;
          local_4a0 = (int *)0x0;
          local_498 = local_4e0;
          local_490 = local_4d8;
          local_488 = local_4d0;
          local_480 = 2;
          local_47c = local_4c4;
          local_478 = local_4c0;
          local_474 = 1;
          local_470 = 1;
          local_468 = (long)local_4c4 * (long)local_4c0;
          local_508[0] = (int)local_368[6] + -1;
          local_4a8 = local_48;
          piVar3 = std::min<int>(&local_458,local_508);
          local_24c = *piVar3;
          local_248 = &local_4a8;
          pfVar4 = (float *)((long)local_4a8 + (long)local_47c * (long)local_24c * local_498);
          local_358 = &local_4a8;
          local_2d0 = local_358;
          if (local_4a0 != (int *)0x0) {
            local_2d4 = 0xffffffff;
            LOCK();
            local_2d8 = *local_4a0;
            *local_4a0 = *local_4a0 + -1;
            UNLOCK();
            if (local_2d8 == 1) {
              if (local_488 == (long *)0x0) {
                local_2b0 = local_4a8;
                if (local_4a8 != (void *)0x0) {
                  free(local_4a8);
                }
              }
              else {
                (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
              }
            }
          }
          local_4a8 = (void *)0x0;
          local_498 = 0;
          local_490 = 0;
          local_480 = 0;
          local_47c = 0;
          local_478 = 0;
          local_474 = 0;
          local_470 = 0;
          local_468 = 0;
          local_4a0 = (int *)0x0;
          local_350 = &local_4f0;
          local_2e0 = local_350;
          if (local_4e8 != (int *)0x0) {
            local_2e4 = 0xffffffff;
            LOCK();
            local_2e8 = *local_4e8;
            *local_4e8 = *local_4e8 + -1;
            UNLOCK();
            if (local_2e8 == 1) {
              if (local_4d0 == (long *)0x0) {
                local_2a8 = local_4f0;
                if (local_4f0 != (void *)0x0) {
                  free(local_4f0);
                }
              }
              else {
                (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
              }
            }
          }
          plVar2 = local_370;
          local_4f0 = (void *)0x0;
          local_4e0 = 0;
          local_4d8 = 0;
          local_4c8 = 0;
          local_4c4 = 0;
          local_4c0 = 0;
          local_4bc = 0;
          local_4b8 = 0;
          local_4b0 = 0;
          local_4e8 = (int *)0x0;
          local_5a4 = (int)local_370[7] + -1;
          local_460 = pfVar4;
          piVar3 = std::min<int>(&local_3f8,&local_5a4);
          local_1d4 = *piVar3;
          local_1c8 = &local_5a0;
          local_d4 = *(int *)((long)plVar2 + 0x2c);
          local_d8 = (int)plVar2[6];
          local_dc = *(undefined4 *)((long)plVar2 + 0x34);
          local_e8 = (void *)(*plVar2 + plVar2[8] * (long)local_1d4 * plVar2[2]);
          local_f0 = plVar2[2];
          local_f4 = (undefined4)plVar2[3];
          local_100 = (long *)plVar2[4];
          local_d0 = &local_5a0;
          local_598 = (int *)0x0;
          local_56c = 1;
          local_78 = (long)local_d4 * (long)local_d8 * local_f0;
          local_560 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_f0;
          local_578 = (int)plVar2[5] + -1;
          if ((int)plVar2[5] == 4) {
            local_560 = (long)*(int *)((long)plVar2 + 0x2c) * (long)(int)plVar2[6];
          }
          local_7c = 0x10;
          local_1d5 = 1;
          local_5a8 = *(int *)((long)local_370 + 0x34) + -1;
          local_5a0 = local_e8;
          local_590 = local_f0;
          local_588 = local_f4;
          local_580 = local_100;
          local_574 = local_d4;
          local_570 = local_d8;
          local_568 = local_dc;
          piVar3 = std::min<int>(&local_454,&local_5a8);
          local_164 = *piVar3;
          local_158 = &local_558;
          local_160 = &local_5a0;
          local_c = local_574;
          local_10 = local_570;
          local_18 = (void *)((long)local_5a0 +
                             (long)local_574 * (long)local_570 * (long)local_164 * local_590);
          local_20 = local_590;
          local_24 = local_588;
          local_30 = local_580;
          local_8 = &local_558;
          local_550 = (int *)0x0;
          local_548 = local_590;
          local_540 = local_588;
          local_538 = local_580;
          local_530 = 2;
          local_52c = local_574;
          local_528 = local_570;
          local_524 = 1;
          local_520 = 1;
          local_518 = (long)local_574 * (long)local_570;
          local_5ac = (int)local_370[6] + -1;
          local_558 = local_18;
          piVar3 = std::min<int>(&local_458,&local_5ac);
          local_25c = *piVar3;
          local_258 = &local_558;
          pfVar4 = (float *)((long)local_558 + (long)local_52c * (long)local_25c * local_548);
          local_340 = &local_558;
          local_300 = local_340;
          if (local_550 != (int *)0x0) {
            local_304 = 0xffffffff;
            LOCK();
            local_308 = *local_550;
            *local_550 = *local_550 + -1;
            UNLOCK();
            if (local_308 == 1) {
              if (local_538 == (long *)0x0) {
                local_298 = local_558;
                if (local_558 != (void *)0x0) {
                  free(local_558);
                }
              }
              else {
                (**(code **)(*local_538 + 0x18))(local_538,local_558);
              }
            }
          }
          local_558 = (void *)0x0;
          local_548 = 0;
          local_540 = 0;
          local_530 = 0;
          local_52c = 0;
          local_528 = 0;
          local_524 = 0;
          local_520 = 0;
          local_518 = 0;
          local_550 = (int *)0x0;
          local_338 = &local_5a0;
          local_310 = local_338;
          if (local_598 != (int *)0x0) {
            local_314 = 0xffffffff;
            LOCK();
            local_318 = *local_598;
            *local_598 = *local_598 + -1;
            UNLOCK();
            if (local_318 == 1) {
              if (local_580 == (long *)0x0) {
                local_290 = local_5a0;
                if (local_5a0 != (void *)0x0) {
                  free(local_5a0);
                }
              }
              else {
                (**(code **)(*local_580 + 0x18))(local_580,local_5a0);
              }
            }
          }
          local_5a0 = (void *)0x0;
          local_590 = 0;
          local_588 = 0;
          local_578 = 0;
          local_574 = 0;
          local_570 = 0;
          local_56c = 0;
          local_568 = 0;
          local_560 = 0;
          local_598 = (int *)0x0;
          local_510 = pfVar4;
          for (local_5b0 = 0; local_5b0 < local_38c; local_5b0 = local_5b0 + 1) {
            fVar5 = binary_op_div::operator()(local_381,local_460,local_510);
            *(float *)(local_400 + (long)local_5b0 * 4) = fVar5;
            local_460 = local_460 + (int)local_44c;
            local_510 = local_510 + (int)local_450;
          }
          local_400 = local_400 + (long)local_38c * 4;
        }
      }
    }
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}